

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.cpp
# Opt level: O1

char16 __thiscall TTD::UtilSupport::TTAutoString::GetCharAt(TTAutoString *this,int32 pos)

{
  int32 iVar1;
  
  if (this->m_contents == (char16 *)0x0) {
    TTDAbort_unrecoverable_error("That doesn\'t make sense.");
  }
  if (-1 < pos) {
    iVar1 = GetLength(this);
    if (pos < iVar1) {
      return this->m_contents[(uint)pos];
    }
  }
  TTDAbort_unrecoverable_error("Not in valid range.");
}

Assistant:

char16 TTAutoString::GetCharAt(int32 pos) const
        {
            TTDAssert(!this->IsNullString(), "That doesn't make sense.");
            TTDAssert(0 <= pos && pos < this->GetLength(), "Not in valid range.");

            return this->m_contents[pos];
        }